

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall google::protobuf::Symbol::IsVisibleFrom(Symbol *this,FileDescriptor *other)

{
  uint8_t uVar1;
  SymbolVisibility SVar2;
  FileDescriptor *pFVar3;
  bool bVar4;
  
  pFVar3 = GetFile(this);
  bVar4 = false;
  if ((other != (FileDescriptor *)0x0) && (bVar4 = false, pFVar3 != (FileDescriptor *)0x0)) {
    uVar1 = this->ptr_->symbol_type_;
    bVar4 = true;
    if (((uVar1 == '\x01') || (uVar1 == '\x04')) && ((this->ptr_[1].symbol_type_ & 1) == 0)) {
      pFVar3 = GetFile(this);
      if (pFVar3 != other) {
        SVar2 = GetEffectiveVisibility(this);
        bVar4 = SVar2 == VISIBILITY_EXPORT;
      }
    }
  }
  return bVar4;
}

Assistant:

bool IsVisibleFrom(FileDescriptor* other) const {
    if (GetFile() == nullptr || other == nullptr) {
      return false;
    }

    // Only Types (message/enum) have visibility.
    if (!IsType()) {
      return true;
    }

    // If we're dealing with a placeholder then just stop now, visibility can't
    // be determined and we have to rely on the proto-compiler previously having
    // checked the validity.
    if (is_placeholder()) {
      return true;
    }

    if (GetFile() == other) {
      return true;
    }

    SymbolVisibility effective_visibility = GetEffectiveVisibility();

    return effective_visibility == SymbolVisibility::VISIBILITY_EXPORT;
  }